

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::InsertRel(Relation *this,string *schema_name,string *table_name)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  undefined1 auStack_48 [40];
  
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)auStack_48);
  make_shared_ptr<duckdb::InsertRelation,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((shared_ptr<duckdb::Relation,_true> *)(auStack_48 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_48,
             table_name);
  uVar1 = auStack_48._24_8_;
  auStack_48._24_8_ = 0;
  this->_vptr_Relation = (_func_int **)auStack_48._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar1;
  auStack_48._16_8_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 0x18));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::InsertRel(const string &schema_name, const string &table_name) {
	return make_shared_ptr<InsertRelation>(shared_from_this(), schema_name, table_name);
}